

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestTextureFramebuffer
          (GetAttachmentParametersTest *this,bool depth_stencil)

{
  ostringstream *this_00;
  GLenum GVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  ulong uVar8;
  GLchar **value;
  GetAttachmentParametersTest *pGVar9;
  long lVar10;
  GLint parameter_legacy;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLint parameter_dsa;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  GetAttachmentParametersTest *local_1e0;
  ulong local_1d8;
  GLchar **local_1d0;
  Enum<int,_2UL> local_1c8;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  bVar3 = true;
  local_1d8 = 0;
  local_1e0 = this;
  do {
    if (local_1d8 == 5) {
      return bVar3;
    }
    pGVar9 = this;
    if (local_1d8 != 2 || depth_stencil) {
      local_1f0 = 0;
      local_1e4 = 0;
      GVar1 = TestRenderbufferFramebuffer::attachments[local_1d8];
      (**(code **)(lVar6 + 0x830))(0x8d40,GVar1,0x8cd0,&local_1f0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glGetFramebufferParameteriv has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x119e);
      (**(code **)(lVar6 + 0x910))(this->m_fbo,GVar1,0x8cd0,&local_1e4);
      iVar4 = (**(code **)(lVar6 + 0x800))();
      pGVar9 = local_1e0;
      if (iVar4 == 0) {
        if (local_1f0 == local_1e4) {
          if (local_1f0 != 0) {
            local_1d0 = TestTextureFramebuffer::attachments_strings + local_1d8;
            uVar8 = local_1d8 ^ 2;
            value = TestTextureFramebuffer::optional_pnames_strings;
            local_1b8 = uVar8;
            for (lVar10 = 0; pGVar9 = local_1e0, lVar10 != 0x34; lVar10 = lVar10 + 4) {
              if (lVar10 != 0x2c || uVar8 != 0) {
                local_1e8 = 0;
                local_1ec = 0;
                uVar2 = *(undefined4 *)((long)TestTextureFramebuffer::optional_pnames + lVar10);
                (**(code **)(lVar6 + 0x830))(0x8d40,GVar1,uVar2,&local_1e8);
                dVar5 = (**(code **)(lVar6 + 0x800))();
                glu::checkError(dVar5,"glGetFramebufferParameteriv has failed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                                ,0x11ee);
                pGVar9 = local_1e0;
                (**(code **)(lVar6 + 0x910))(local_1e0->m_fbo,GVar1,uVar2,&local_1ec);
                iVar4 = (**(code **)(lVar6 + 0x800))();
                if (iVar4 == 0) {
                  uVar8 = local_1b8;
                  if (local_1e8 == local_1ec) goto LAB_00b07956;
                  local_1b0 = (undefined1  [8])
                              ((local_1e0->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::operator<<(&local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ");
                  std::ostream::operator<<((ostringstream *)&local_1a8,local_1ec);
                  std::operator<<(&local_1a8,", but ");
                  std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
                  std::operator<<(&local_1a8," was expected for ");
                  std::ostream::_M_insert<void_const*>((ostringstream *)&local_1a8);
                  std::operator<<(&local_1a8," parameter name  for ");
                  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1d0);
                  std::operator<<(&(pMVar7->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,
                                  " attachment of texture framebuffer object.");
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                }
                else {
                  local_1b0 = (undefined1  [8])
                              ((pGVar9->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::operator<<(&local_1a8,
                                  "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
                                 );
                  local_1c8.m_getName = glu::getErrorName;
                  local_1c8.m_value = iVar4;
                  tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,&local_1a8);
                  std::operator<<(&local_1a8," error when called with ");
                  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
                  std::operator<<(&(pMVar7->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,
                                  " parameter name for ");
                  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1d0);
                  this_00 = &pMVar7->m_str;
                  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                                  " attachment of texture framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                                 );
                  std::ostream::operator<<(this_00,local_1f0);
                  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,".");
                  tcu::MessageBuilder::operator<<
                            (pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                bVar3 = false;
                uVar8 = local_1b8;
              }
LAB_00b07956:
              value = value + 1;
            }
          }
        }
        else {
          local_1b0 = (undefined1  [8])((local_1e0->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ");
          uVar8 = local_1d8;
          std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
          std::operator<<(&local_1a8,", but ");
          std::ostream::operator<<((ostringstream *)&local_1a8,local_1f0);
          std::operator<<(&local_1a8,
                          " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of texture framebuffer object."
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          bVar3 = false;
          local_1d8 = uVar8;
        }
      }
      else {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,
                        "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ");
        local_1c8.m_getName = glu::getErrorName;
        local_1c8.m_value = iVar4;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,&local_1a8);
        uVar8 = local_1d8;
        std::operator<<(&local_1a8,
                        " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                       );
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,
                            TestTextureFramebuffer::attachments_strings + uVar8);
        std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        " attachment of texture framebuffer object.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar3 = false;
        local_1d8 = uVar8;
        pGVar9 = local_1e0;
      }
    }
    local_1d8 = local_1d8 + 1;
    this = pGVar9;
  } while( true );
}

Assistant:

bool GetAttachmentParametersTest::TestTextureFramebuffer(bool depth_stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_DEPTH_ATTACHMENT, GL_STENCIL_ATTACHMENT, GL_DEPTH_STENCIL_ATTACHMENT,
											   GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };

	static const glw::GLchar* attachments_strings[] = { "GL_DEPTH_ATTACHMENT", "GL_STENCIL_ATTACHMENT",
														"GL_DEPTH_STENCIL_ATTACHMENT", "GL_COLOR_ATTACHMENT0",
														"GL_COLOR_ATTACHMENT1" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		/* Omit DEPTH_STENCIL_ATTACHMENT attachment if the renderbuffer is not depth-stencil. */
		if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
		{
			if (!depth_stencil)
			{
				continue;
			}
		}

		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of texture framebuffer object." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy << " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter "
												   "name of texture framebuffer object."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = { GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME,
														   GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL,
														   GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE,
														   GL_FRAMEBUFFER_ATTACHMENT_LAYERED,
														   GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER,
														   GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
														   GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING };

			static const glw::GLchar* optional_pnames_strings[] = { "GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME",
																	"GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL",
																	"GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE",
																	"GL_FRAMEBUFFER_ATTACHMENT_LAYERED",
																	"GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER",
																	"GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE",
																	"GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING" };

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				/* Omit FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE pname when DEPTH_STENCIL_ATTACHMENT attachment is used. */
				if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
				{
					if (optional_pnames[i] == GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE)
					{
						continue;
					}
				}

				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of texture framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of texture framebuffer object." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}